

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
* __thiscall
rangeless::fn::impl::
maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
::operator=(maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
            *this,maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
                  *other)

{
  seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
  *val;
  maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
  *other_local;
  maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
  *this_local;
  
  if (this != other) {
    if ((other->m_empty & 1U) == 0) {
      val = operator*(other);
      reset(this,val);
      reset(other);
    }
    else {
      reset(this);
    }
  }
  return this;
}

Assistant:

maybe& operator=(maybe&& other) noexcept
        {
            if(this == &other) {
                ;
            } else if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            } else {
                reset();
            }
            return *this;
        }